

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

size_t __thiscall Common::analyzeMemory(Common *this,TaskHandle *head)

{
  pointer psVar1;
  long *plVar2;
  pointer pOVar3;
  element_type *peVar4;
  OperandHandle *pOVar5;
  shared_ptr<Operand> *operand;
  pointer psVar6;
  _Rb_tree_node_base *p_Var7;
  pointer pOVar8;
  ulong uVar9;
  shared_ptr<Operand> *operand_1;
  ulong uVar10;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *__range1;
  ulong uVar11;
  TaskHandle task;
  __shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  analyzeTopology(this,head);
  psVar1 = (this->operands).
           super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->operands).
                super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    ((psVar6->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->on_device = false;
  }
  uVar10 = 0;
  for (p_Var7 = (this->already_on)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(this->already_on)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    plVar2 = *(long **)(p_Var7 + 1);
    *(undefined1 *)(plVar2 + 4) = 1;
    uVar10 = uVar10 + *plVar2;
  }
  std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
  uVar11 = uVar10;
  do {
    if (local_28._M_ptr == (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
      return uVar10;
    }
    pOVar8 = ((local_28._M_ptr)->ins).
             super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (pOVar8 != ((local_28._M_ptr)->ins).
                     super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
      pOVar5 = &pOVar8->operand;
      pOVar8 = pOVar8 + 1;
      if (((pOVar5->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->on_device ==
          false) {
        __assert_fail("usage.operand->on_device",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]DLMO/schedule.hpp"
                      ,0x212,"size_t Common::analyzeMemory(TaskHandle &) const");
      }
    }
    pOVar3 = ((local_28._M_ptr)->outs).
             super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pOVar8 = ((local_28._M_ptr)->outs).
                  super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                  super__Vector_impl_data._M_start; pOVar8 != pOVar3; pOVar8 = pOVar8 + 1) {
      peVar4 = (pOVar8->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar4->on_device == false) {
        peVar4->on_device = true;
        uVar11 = uVar11 + peVar4->size;
      }
    }
    uVar9 = (local_28._M_ptr)->workspace + uVar11;
    (local_28._M_ptr)->execution_memory = uVar9;
    psVar1 = ((local_28._M_ptr)->to_dealloc_after).
             super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = ((local_28._M_ptr)->to_dealloc_after).
                  super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1)
    {
      peVar4 = (psVar6->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar4->on_device = false;
      uVar11 = uVar11 - peVar4->size;
    }
    if (uVar10 <= uVar9) {
      uVar10 = uVar9;
    }
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_28,
               &((local_28._M_ptr)->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
  } while( true );
}

Assistant:

size_t analyzeMemory(TaskHandle &head) const {
        // Analyze topology
        analyzeTopology(head);

        // Operands already on device
        size_t current_memory = 0;
        for (auto &operand: operands) {
            operand->on_device = false;
        }
        for (auto &operand: already_on) {
            operand->on_device = true;
            current_memory += operand->size;
        }
        size_t peak_memory = current_memory;

        // Loop all tasks
        LOOP(task, head) {
            for (auto &usage: task->ins) {
                assert(usage.operand->on_device);
            }
            for (auto &usage: task->outs) {
                if (not usage.operand->on_device) {
                    usage.operand->on_device = true;
                    current_memory += usage.operand->size;
                }
            }
            task->execution_memory = current_memory + task->workspace;
            peak_memory = std::max(peak_memory, task->execution_memory);

            for (auto &operand: task->to_dealloc_after) {
                operand->on_device = false;
                current_memory -= operand->size;
            }
        }
        return peak_memory;
    }